

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O3

bool sptk::SnPrintf<sptk::int24_t>
               (int24_t *data,string *print_format,size_t buffer_size,char *buffer)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = false;
  if (((buffer != (char *)0x0) && (buffer_size != 0)) && (print_format->_M_string_length != 0)) {
    lVar4 = (ulong)data->value[1] << 8;
    uVar3 = (uint)data->value[0] | (uint)data->value[2] << 0x10;
    iVar2 = (int)lVar4;
    uVar1 = (iVar2 + uVar3) - 0x1000000;
    if (-1 < (char)data->value[2]) {
      uVar1 = uVar3 + iVar2;
    }
    iVar2 = snprintf(buffer,buffer_size,(print_format->_M_dataplus)._M_p,(ulong)uVar1,(ulong)uVar1,
                     lVar4,0);
    bVar5 = -1 < iVar2;
  }
  return bVar5;
}

Assistant:

bool SnPrintf(int24_t data, const std::string& print_format,
              std::size_t buffer_size, char* buffer) {
  if (print_format.empty() || 0 == buffer_size || NULL == buffer) {
    return false;
  }

  return (std::snprintf(buffer, buffer_size, print_format.c_str(),
                        static_cast<int>(data)) < 0)
             ? false
             : true;
}